

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanMemoryManager::~VulkanMemoryManager(VulkanMemoryManager *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Hash_node_base *p_Var3;
  char **in_stack_ffffffffffffff20;
  string _msg;
  unsigned_long PeakDeviceLocalPages;
  char *local_a8;
  char *local_a0;
  unsigned_long PeakHostVisiblePages;
  ulong local_90;
  undefined4 local_88;
  ulong local_80;
  unsigned_long local_78;
  char local_70 [8];
  ulong local_68;
  ulong local_60;
  char local_58 [8];
  ulong local_50;
  unsigned_long local_48;
  char local_40 [8];
  ulong local_38;
  
  this->_vptr_VulkanMemoryManager = (_func_int **)&PTR_OnNewPageCreated_00936e20;
  local_60 = (this->m_PeakAllocatedSize)._M_elems[0];
  PeakDeviceLocalPages = local_60 / this->m_DeviceLocalPageSize;
  local_90 = (this->m_PeakAllocatedSize)._M_elems[1];
  PeakHostVisiblePages = local_90 / this->m_HostVisiblePageSize;
  local_48 = (this->m_PeakUsedSize)._M_elems[0];
  local_40[0] = '\x02';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_58[0] = '\x02';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_a8 = " pages)";
  local_a0 = " pages)";
  if (PeakDeviceLocalPages == 1) {
    local_a0 = " page)";
  }
  local_78 = (this->m_PeakUsedSize)._M_elems[1];
  local_70[0] = '\x02';
  local_70[1] = '\0';
  local_70[2] = '\0';
  local_70[3] = '\0';
  local_88 = 2;
  if (PeakHostVisiblePages == 1) {
    local_a8 = " page)";
  }
  local_80 = local_90;
  local_68 = local_90;
  local_50 = local_60;
  local_38 = local_60;
  Diligent::
  FormatString<char[22],std::__cxx11::string,char[79],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*,char[71],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
            (&_msg,(Diligent *)"VulkanMemoryManager \'",(char (*) [22])&this->m_MgrName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "\' stats:\n                       Peak used/allocated device-local memory size: ",
             (char (*) [79])&local_48,(MemorySizeFormatter<unsigned_long> *)" / ",
             (char (*) [4])&local_60,(MemorySizeFormatter<unsigned_long> *)0x6cacc0,
             (char (*) [3])&PeakDeviceLocalPages,(unsigned_long *)&local_a0,
             (char **)"\n                       Peak used/allocated host-visible memory size: ",
             (char (*) [71])&local_78,(MemorySizeFormatter<unsigned_long> *)" / ",
             (char (*) [4])&local_90,(MemorySizeFormatter<unsigned_long> *)0x6cacc0,
             (char (*) [3])&PeakHostVisiblePages,(unsigned_long *)&local_a8,
             in_stack_ffffffffffffff20);
  if (Diligent::DebugMessageCallback != (undefined *)0x0) {
    (*(code *)Diligent::DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_msg._M_dataplus._M_p != &_msg.field_2) {
    operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
  }
  p_Var3 = (this->m_Pages)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      if (p_Var3[0x1c]._M_nxt != p_Var3[0x1b]._M_nxt) {
        Diligent::FormatString<char[42]>
                  (&_msg,(char (*) [42])"The page contains outstanding allocations");
        Diligent::DebugAssertionFailed
                  (_msg._M_dataplus._M_p,"~VulkanMemoryManager",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
                   ,0x105);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_msg._M_dataplus._M_p != &_msg.field_2) {
          operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  if (((this->m_CurrUsedSize)._M_elems[0].super___atomic_base<long>._M_i != 0) ||
     ((this->m_CurrUsedSize)._M_elems[1].super___atomic_base<long>._M_i != 0)) {
    Diligent::FormatString<char[39]>(&_msg,(char (*) [39])"Not all allocations have been released");
    Diligent::DebugAssertionFailed
              (_msg._M_dataplus._M_p,"~VulkanMemoryManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0x106);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_msg._M_dataplus._M_p != &_msg.field_2) {
      operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>,_std::__detail::_Select1st,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable(&(this->m_Pages)._M_h);
  pcVar1 = (this->m_MgrName)._M_dataplus._M_p;
  paVar2 = &(this->m_MgrName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

VulkanMemoryManager::~VulkanMemoryManager()
{
    auto PeakDeviceLocalPages = m_PeakAllocatedSize[0] / m_DeviceLocalPageSize;
    auto PeakHostVisiblePages = m_PeakAllocatedSize[1] / m_HostVisiblePageSize;
    LOG_INFO_MESSAGE("VulkanMemoryManager '", m_MgrName, "' stats:\n"
                                                         "                       Peak used/allocated device-local memory size: ",
                     Diligent::FormatMemorySize(m_PeakUsedSize[0], 2, m_PeakAllocatedSize[0]), " / ",
                     Diligent::FormatMemorySize(m_PeakAllocatedSize[0], 2, m_PeakAllocatedSize[0]),
                     " (", PeakDeviceLocalPages, (PeakDeviceLocalPages == 1 ? " page)" : " pages)"),
                     "\n                       Peak used/allocated host-visible memory size: ",
                     Diligent::FormatMemorySize(m_PeakUsedSize[1], 2, m_PeakAllocatedSize[1]), " / ",
                     Diligent::FormatMemorySize(m_PeakAllocatedSize[1], 2, m_PeakAllocatedSize[1]),
                     " (", PeakHostVisiblePages, (PeakHostVisiblePages == 1 ? " page)" : " pages)"));

    for (auto it = m_Pages.begin(); it != m_Pages.end(); ++it)
        VERIFY(it->second.IsEmpty(), "The page contains outstanding allocations");
    VERIFY(m_CurrUsedSize[0] == 0 && m_CurrUsedSize[1] == 0, "Not all allocations have been released");
}